

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Access(int g_a,int *lo,int *hi,void *ptr,int *ld)

{
  Integer IVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  int *piVar5;
  Integer _ga_work [7];
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer local_e8 [7];
  long lStack_b0;
  Integer local_a8 [7];
  long lStack_70;
  Integer local_68 [7];
  
  IVar1 = pnga_ndim((long)g_a);
  lVar3 = 0;
  lVar2 = 0;
  if (0 < IVar1) {
    lVar2 = IVar1;
  }
  plVar4 = &lStack_70 + IVar1;
  for (; lVar2 != lVar3; lVar3 = lVar3 + 1) {
    *plVar4 = (long)lo[lVar3] + 1;
    plVar4 = plVar4 + -1;
  }
  plVar4 = &lStack_b0 + IVar1;
  for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
    *plVar4 = (long)hi[lVar3] + 1;
    plVar4 = plVar4 + -1;
  }
  pnga_access_ptr((long)g_a,local_68,local_a8,ptr,local_e8);
  lVar3 = 0;
  lVar2 = IVar1 + -1;
  if (IVar1 + -1 < 1) {
    lVar2 = lVar3;
  }
  piVar5 = ld + IVar1 + -2;
  for (; lVar2 != lVar3; lVar3 = lVar3 + 1) {
    *piVar5 = (int)local_e8[lVar3];
    piVar5 = piVar5 + -1;
  }
  return;
}

Assistant:

void NGA_Access(int g_a, int lo[], int hi[], void *ptr, int ld[])
{
     Integer a=(Integer)g_a;
     Integer ndim = wnga_ndim(a);
     Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
     Integer _ga_work[MAXDIM];
     COPYINDEX_C2F(lo,_ga_lo,ndim);
     COPYINDEX_C2F(hi,_ga_hi,ndim);

     wnga_access_ptr(a,_ga_lo, _ga_hi, ptr, _ga_work);
     COPYF2C(_ga_work,ld, ndim-1);
}